

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_scalar_surf_tec
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_CELL pRVar1;
  uint uVar2;
  uint uVar3;
  FILE *__s;
  ulong uVar4;
  REF_NODE ref_node;
  bool bVar5;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_GLOB *local_60;
  REF_NODE local_58;
  long local_50;
  long local_48;
  int local_40;
  uint local_3c;
  REF_DBL *local_38;
  
  ref_node = ref_grid->node;
  local_38 = scalar;
  if (ref_grid->mpi->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xdda,"ref_gather_scalar_surf_tec","unable to open file");
      return 2;
    }
    local_58 = ref_node;
    fwrite("title=\"tecplot refine gather\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,__s);
    if (scalar_names == (char **)0x0) {
      if (0 < ldim) {
        uVar2 = 1;
        do {
          fprintf(__s," \"V%d\"",(ulong)uVar2);
          bVar5 = uVar2 != ldim;
          uVar2 = uVar2 + 1;
        } while (bVar5);
      }
    }
    else if (0 < ldim) {
      uVar4 = 0;
      do {
        fprintf(__s," \"%s\"",scalar_names[uVar4]);
        uVar4 = uVar4 + 1;
      } while ((uint)ldim != uVar4);
    }
    fputc(10,__s);
    ref_node = local_58;
  }
  else {
    __s = (FILE *)0x0;
  }
  uVar2 = ref_node_synchronize_globals(ref_node);
  if (uVar2 == 0) {
    local_58 = ref_node;
    uVar2 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_3c,&local_40);
    if (uVar2 == 0) {
      uVar2 = local_3c;
      if ((int)local_3c <= local_40) {
        do {
          pRVar1 = ref_grid->cell[3];
          uVar3 = ref_grid_compact_cell_id_nodes
                            (ref_grid,pRVar1,uVar2,&local_48,&local_50,&local_60);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xded,"ref_gather_scalar_surf_tec",(ulong)uVar3,"l2c");
            return uVar3;
          }
          if (0 < local_50 && 0 < local_48) {
            if (ref_grid->mpi->id == 0) {
              fprintf(__s,"zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                      ,(ulong)uVar2,local_48,local_50,"point","fetriangle");
            }
            uVar3 = ref_gather_node_tec_part(local_58,local_48,local_60,ldim,local_38,(FILE *)__s);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xdf7,"ref_gather_scalar_surf_tec",(ulong)uVar3);
              return uVar3;
            }
            uVar3 = ref_gather_cell_id_tec(local_58,pRVar1,uVar2,local_50,local_60,0,(FILE *)__s);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xdfa,"ref_gather_scalar_surf_tec",(ulong)uVar3,"t");
              return uVar3;
            }
          }
          if (local_60 != (REF_GLOB *)0x0) {
            free(local_60);
          }
          pRVar1 = ref_grid->cell[6];
          uVar3 = ref_grid_compact_cell_id_nodes
                            (ref_grid,pRVar1,uVar2,&local_48,&local_50,&local_60);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe01,"ref_gather_scalar_surf_tec",(ulong)uVar3,"l2c");
            return uVar3;
          }
          if (0 < local_50 && 0 < local_48) {
            if (ref_grid->mpi->id == 0) {
              fprintf(__s,
                      "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                      (ulong)uVar2,local_48,local_50,"point","fequadrilateral");
            }
            uVar3 = ref_gather_node_tec_part(local_58,local_48,local_60,ldim,local_38,(FILE *)__s);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xe0b,"ref_gather_scalar_surf_tec",(ulong)uVar3);
              return uVar3;
            }
            uVar3 = ref_gather_cell_id_tec(local_58,pRVar1,uVar2,local_50,local_60,0,(FILE *)__s);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xe0e,"ref_gather_scalar_surf_tec",(ulong)uVar3,"t");
              return uVar3;
            }
          }
          if (local_60 != (REF_GLOB *)0x0) {
            free(local_60);
          }
          bVar5 = (int)uVar2 < local_40;
          uVar2 = uVar2 + 1;
        } while (bVar5);
      }
      uVar2 = 0;
      if (ref_grid->mpi->id == 0) {
        fclose(__s);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xde7,"ref_gather_scalar_surf_tec",(ulong)uVar2,"range");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xde5,
           "ref_gather_scalar_surf_tec",(ulong)uVar2,"sync");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_surf_tec(REF_GRID ref_grid, REF_INT ldim,
                                              REF_DBL *scalar,
                                              const char **scalar_names,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  FILE *file;
  REF_INT i;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_INT min_faceid, max_faceid, cell_id;
  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine gather\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    ref_cell = ref_grid_tri(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"tri%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fetriangle");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);

    ref_cell = ref_grid_qua(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"quad%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fequadrilateral");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}